

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::ReturnValueVerifier::
     verifyRecursive<int>
               (AtomicOperation operation,int index,int valueSoFar,bool (*argsUsed) [5],
               int (*args) [5],int (*returnValues) [5])

{
  bool bVar1;
  uint valueSoFar_00;
  ulong uVar2;
  
  bVar1 = true;
  if (index < 5) {
    uVar2 = 0xffffffffffffffff;
    do {
      if (((*argsUsed)[uVar2 + 1] == false) && ((*returnValues)[uVar2 + 1] == valueSoFar)) {
        (*argsUsed)[uVar2 + 1] = true;
        if (operation < ATOMIC_OPERATION_COMP_SWAP) {
          valueSoFar_00 = (*args)[uVar2 + 1];
          switch(operation) {
          case ATOMIC_OPERATION_ADD:
            valueSoFar_00 = valueSoFar_00 + valueSoFar;
            break;
          case ATOMIC_OPERATION_MIN:
            if (valueSoFar < (int)valueSoFar_00) {
              valueSoFar_00 = valueSoFar;
            }
            break;
          case ATOMIC_OPERATION_MAX:
            if ((int)valueSoFar_00 < valueSoFar) {
              valueSoFar_00 = valueSoFar;
            }
            break;
          case ATOMIC_OPERATION_AND:
            valueSoFar_00 = valueSoFar_00 & valueSoFar;
            break;
          case ATOMIC_OPERATION_OR:
            valueSoFar_00 = valueSoFar_00 | valueSoFar;
            break;
          case ATOMIC_OPERATION_XOR:
            valueSoFar_00 = valueSoFar_00 ^ valueSoFar;
          }
        }
        else {
          valueSoFar_00 = 0xffffffff;
        }
        bVar1 = verifyRecursive<int>(operation,index + 1,valueSoFar_00,argsUsed,args,returnValues);
        if (bVar1) {
          return true;
        }
        (*argsUsed)[uVar2 + 1] = false;
      }
      uVar2 = uVar2 + 1;
      bVar1 = uVar2 < 4;
    } while (uVar2 != 4);
  }
  return bVar1;
}

Assistant:

static bool verifyRecursive (AtomicOperation operation, int index, T valueSoFar, bool (&argsUsed)[NUM_INVOCATIONS_PER_PIXEL], const T (&args)[NUM_INVOCATIONS_PER_PIXEL], const T (&returnValues)[NUM_INVOCATIONS_PER_PIXEL])
	{
		if (index < NUM_INVOCATIONS_PER_PIXEL)
		{
			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				if (!argsUsed[i] && compare(returnValues[i], valueSoFar))
				{
					argsUsed[i] = true;
					if (verifyRecursive(operation, index+1, computeBinaryAtomicOperationResult(operation, valueSoFar, args[i]), argsUsed, args, returnValues))
						return true;
					argsUsed[i] = false;
				}
			}

			return false;
		}
		else
			return true;
	}